

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType)

{
  bool bVar1;
  Which WVar2;
  uchar local_2a;
  char cStack_29;
  uchar uStack_28;
  char cStack_27;
  ArgSlot local_26;
  undefined1 auStack_24 [2];
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCodeAsmJs op_local;
  AsmJsByteCodeWriter *this_local;
  AsmJsRetType retType_local;
  
  local_26 = givenArgCount;
  _auStack_24 = functionRegister;
  unique0x100000d8 = returnValueRegister;
  this_local._0_4_ = retType.which_;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<char,unsigned_int>
                    (&cStack_29,returnValueRegister);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                         (&uStack_28,_auStack_24), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_short>
                        (&local_2a,local_26), bVar1)) {
    WVar2 = AsmJsRetType::which((AsmJsRetType *)&this_local);
    bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<char,char>(&cStack_27,(char)WVar2);
    if (bVar1) {
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
                (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_2a,4,
                 &this->super_ByteCodeWriter,false);
      return true;
    }
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType)
    {
        OpLayoutT_AsmCall<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::template Assign<int8>(layout.ReturnType, (int8)retType.which()))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }